

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int vm_builtin_exit(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pValue;
  char *zString;
  int iLen;
  int local_1c;
  
  if (0 < nArg) {
    pValue = *apArg;
    if ((pValue->iFlags & 1U) == 0) {
      if ((pValue->iFlags & 2U) != 0) {
        jx9MemObjToInteger(pValue);
        pCtx->pVm->iExitStatus = *(sxi32 *)&pValue->x;
      }
    }
    else {
      local_1c = 0;
      zString = jx9_value_to_string(pValue,&local_1c);
      jx9_context_output(pCtx,zString,local_1c);
    }
  }
  return -10;
}

Assistant:

static int vm_builtin_exit(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	if( nArg > 0 ){
		if( jx9_value_is_string(apArg[0]) ){
			const char *zData;
			int iLen = 0;
			/* Print exit message */
			zData = jx9_value_to_string(apArg[0], &iLen);
			jx9_context_output(pCtx, zData, iLen);
		}else if(jx9_value_is_int(apArg[0]) ){
			sxi32 iExitStatus;
			/* Record exit status code */
			iExitStatus = jx9_value_to_int(apArg[0]);
			pCtx->pVm->iExitStatus = iExitStatus;
		}
	}
	/* Abort processing immediately */
	return JX9_ABORT;
}